

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

Option * __thiscall
CLI::Option::transform
          (Option *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *func)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  fStack_38;
  
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&fStack_38,func);
  ::std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::
  emplace_back<CLI::Option::transform(std::function<std::__cxx11::string(std::__cxx11::string)>)::_lambda(std::__cxx11::string&)_1_>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&this->validators_,(anon_class_32_1_898bcfc2 *)&fStack_38);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return this;
}

Assistant:

Option *transform(std::function<std::string(std::string)> func) {
        validators_.emplace_back([func](std::string &inout) {
            try {
                inout = func(inout);
            } catch(const ValidationError &e) {
                return std::string(e.what());
            }
            return std::string();
        });
        return this;
    }